

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::combineOr(OptimizeInstructions *this,Binary *curr)

{
  Expression *pEVar1;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_00;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  matcher_02;
  bool bVar2;
  Id IVar3;
  Binary *other;
  Match *this_00;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R8;
  bool local_5f1;
  bool local_5db;
  byte local_5c9;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_5b8;
  Binary *local_578 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_568;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_530;
  Binary *local_4f0 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_4e0;
  Const *local_4a8;
  Const *cy_1;
  Const *cx_1;
  Expression *y_1;
  Expression *x_1;
  Binary *by_1;
  Binary *bx_1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_470;
  Binary *local_430 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_420;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_3e8;
  Binary *local_3a8 [2];
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_398;
  Const *local_360;
  Const *cy;
  Const *cx;
  Expression *y;
  Expression *x;
  Binary *by;
  Binary *bx;
  EffectAnalyzer local_328;
  byte local_1a1;
  EffectAnalyzer local_1a0;
  Binary *local_30;
  Binary *right;
  Binary *left;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  left = curr;
  curr_local = (Binary *)this;
  if (curr->op != OrInt32) {
    __assert_fail("curr->op == OrInt32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xc5e,"Expression *wasm::OptimizeInstructions::combineOr(Binary *)");
  }
  right = Expression::dynCast<wasm::Binary>(curr->left);
  if ((right != (Binary *)0x0) &&
     (local_30 = Expression::dynCast<wasm::Binary>(left->right), local_30 != (Binary *)0x0)) {
    local_1a1 = 0;
    bx._7_1_ = 0;
    local_5c9 = 0;
    if (right->op != local_30->op) {
      curr = (Binary *)local_30->left;
      bVar2 = ExpressionAnalyzer::equal(right->left,(Expression *)curr);
      local_5c9 = 0;
      if (bVar2) {
        curr = (Binary *)local_30->right;
        bVar2 = ExpressionAnalyzer::equal(right->right,(Expression *)curr);
        local_5c9 = 0;
        if (bVar2) {
          curr = (Binary *)this;
          effects(&local_1a0,this,right->left);
          local_1a1 = 1;
          bVar2 = EffectAnalyzer::hasSideEffects(&local_1a0);
          local_5c9 = 0;
          if (!bVar2) {
            curr = (Binary *)this;
            effects(&local_328,this,right->right);
            bx._7_1_ = 1;
            bVar2 = EffectAnalyzer::hasSideEffects(&local_328);
            local_5c9 = bVar2 ^ 0xff;
          }
        }
      }
    }
    if ((bx._7_1_ & 1) != 0) {
      EffectAnalyzer::~EffectAnalyzer(&local_328);
    }
    if ((local_1a1 & 1) != 0) {
      EffectAnalyzer::~EffectAnalyzer(&local_1a0);
    }
    if ((((local_5c9 & 1) != 0) && (right->op == EqInt32)) && (local_30->op == GtSInt32)) {
      right->op = GeSInt32;
      return (Expression *)right;
    }
  }
  pEVar1 = left->left;
  local_3a8[0] = (Binary *)
                 Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,
                            (Expression **)curr);
  Match::ival(&local_3e8,&cy);
  other = (Binary *)&by;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
            (&local_398,(Match *)other,local_3a8,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_3e8,in_R8);
  matcher._8_8_ = local_398._8_8_;
  matcher.binder = local_398.binder;
  matcher.submatchers.curr.binder = local_398.submatchers.curr.binder;
  matcher.submatchers.curr._8_8_ = local_398.submatchers.curr._8_8_;
  matcher.submatchers.next.curr = local_398.submatchers.next.curr;
  matcher.submatchers.next.next.curr = local_398.submatchers.next.next.curr;
  matcher.submatchers.next.next._8_8_ = local_398.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                    (pEVar1,matcher);
  local_5db = false;
  if (bVar2) {
    pEVar1 = left->right;
    local_430[0] = (Binary *)
                   Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&cx,
                              (Expression **)other);
    Match::ival(&local_470,&local_360);
    other = (Binary *)&x;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_420,(Match *)other,local_430,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_470,in_R8);
    matcher_00._8_8_ = local_420._8_8_;
    matcher_00.binder = local_420.binder;
    matcher_00.submatchers.curr.binder = local_420.submatchers.curr.binder;
    matcher_00.submatchers.curr._8_8_ = local_420.submatchers.curr._8_8_;
    matcher_00.submatchers.next.curr = local_420.submatchers.next.curr;
    matcher_00.submatchers.next.next.curr = local_420.submatchers.next.next.curr;
    matcher_00.submatchers.next.next._8_8_ = local_420.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      (pEVar1,matcher_00);
    local_5db = false;
    if ((bVar2) && (local_5db = false, by->op == x[1]._id)) {
      other = (Binary *)
              &(cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type;
      bVar2 = wasm::Type::operator==(&y->type,(Type *)other);
      local_5db = false;
      if (bVar2) {
        other = (Binary *)&local_360->value;
        bVar2 = wasm::Literal::operator==(&cy->value,(Literal *)other);
        local_5db = false;
        if (bVar2) {
          other = by;
          local_5db = inversesOr(this,by);
        }
      }
    }
  }
  if (local_5db == false) {
    pEVar1 = left->left;
    local_4f0[0] = (Binary *)
                   Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y_1,
                              (Expression **)other);
    Match::ival(&local_530,&cy_1);
    this_00 = (Match *)&by_1;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              (&local_4e0,this_00,local_4f0,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_530,in_R8);
    matcher_01._8_8_ = local_4e0._8_8_;
    matcher_01.binder = local_4e0.binder;
    matcher_01.submatchers.curr.binder = local_4e0.submatchers.curr.binder;
    matcher_01.submatchers.curr._8_8_ = local_4e0.submatchers.curr._8_8_;
    matcher_01.submatchers.next.curr = local_4e0.submatchers.next.curr;
    matcher_01.submatchers.next.next.curr = local_4e0.submatchers.next.next.curr;
    matcher_01.submatchers.next.next._8_8_ = local_4e0.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                      (pEVar1,matcher_01);
    local_5f1 = false;
    if (bVar2) {
      pEVar1 = left->right;
      local_578[0] = (Binary *)
                     Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                &cx_1,(Expression **)this_00);
      Match::ival(&local_5b8,&local_4a8);
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                (&local_568,(Match *)&x_1,local_578,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_5b8,in_R8);
      matcher_02._8_8_ = local_568._8_8_;
      matcher_02.binder = local_568.binder;
      matcher_02.submatchers.curr.binder = local_568.submatchers.curr.binder;
      matcher_02.submatchers.curr._8_8_ = local_568.submatchers.curr._8_8_;
      matcher_02.submatchers.next.curr = local_568.submatchers.next.curr;
      matcher_02.submatchers.next.next.curr = local_568.submatchers.next.next.curr;
      matcher_02.submatchers.next.next._8_8_ = local_568.submatchers.next.next._8_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Binary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                        (pEVar1,matcher_02);
      local_5f1 = false;
      if ((bVar2) && (local_5f1 = false, by_1->op == x_1[1]._id)) {
        bVar2 = wasm::Type::operator==
                          (&y_1->type,
                           &(cx_1->super_SpecificExpression<(wasm::Expression::Id)14>).
                            super_Expression.type);
        local_5f1 = false;
        if (bVar2) {
          bVar2 = wasm::Literal::operator==(&cy_1->value,&local_4a8->value);
          local_5f1 = false;
          if (bVar2) {
            local_5f1 = preserveOr(this,by_1);
          }
        }
      }
    }
    if (local_5f1 == false) {
      this_local = (OptimizeInstructions *)0x0;
    }
    else {
      IVar3 = Abstract::getBinary((Type)(y_1->type).id,Or);
      x_1[1]._id = IVar3;
      (x_1->type).id = (y_1->type).id;
      x_1[1].type.id = (uintptr_t)y_1;
      *(Const **)(x_1 + 2) = cx_1;
      by_1->left = x_1;
      this_local = (OptimizeInstructions *)by_1;
    }
  }
  else {
    bx_1 = (Binary *)(y->type).id;
    IVar3 = Abstract::getBinary((Type)bx_1,And);
    x[1]._id = IVar3;
    (x->type).id = (y->type).id;
    x[1].type.id = (uintptr_t)y;
    *(Const **)(x + 2) = cx;
    by->left = x;
    this_local = (OptimizeInstructions *)by;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* combineOr(Binary* curr) {
    assert(curr->op == OrInt32);

    using namespace Abstract;
    using namespace Match;

    if (auto* left = curr->left->dynCast<Binary>()) {
      if (auto* right = curr->right->dynCast<Binary>()) {
        if (left->op != right->op &&
            ExpressionAnalyzer::equal(left->left, right->left) &&
            ExpressionAnalyzer::equal(left->right, right->right) &&
            !effects(left->left).hasSideEffects() &&
            !effects(left->right).hasSideEffects()) {
          switch (left->op) {
            //   (x > y) | (x == y)    ==>    x >= y
            case EqInt32: {
              if (right->op == GtSInt32) {
                left->op = GeSInt32;
                return left;
              }
              break;
            }
            default: {
            }
          }
        }
      }
    }
    {
      // Binary operations that inverses a bitwise OR to AND.
      // If F(x) = binary(x, c), and F(x) inverses OR,
      // that is,
      //
      //   F(x) | F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesOr(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise OR can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves OR,
      // that is,
      //
      //   F(x) | F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) | binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveOr(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }